

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeptData.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PeptData::GenCleavageSites
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          PeptData *this,char *compact_sequence,size_t sequence_length)

{
  uint in_EAX;
  uint uVar1;
  runtime_error *this_00;
  undefined8 local_28;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = (ulong)in_EAX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (__return_storage_ptr__,(uint *)((long)&local_28 + 4));
  if (this->enzyme_type_ == Trypsin) {
    uVar1 = 1;
    while( true ) {
      local_28 = CONCAT44(local_28._4_4_,uVar1);
      if (sequence_length <= uVar1) break;
      if (((compact_sequence[uVar1 - 1] == 'R') || (compact_sequence[uVar1 - 1] == 'K')) &&
         (compact_sequence[uVar1] != 'P')) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (__return_storage_ptr__,(value_type_conflict1 *)&local_28);
        uVar1 = (uint)local_28;
      }
      uVar1 = uVar1 + 1;
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Enzyme type is not supported.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<unsigned> GenCleavageSites(const char* compact_sequence, size_t sequence_length) const {
        std::vector<unsigned> cleavage_sites;
        cleavage_sites.push_back(0);
        switch (enzyme_type_) {  // to support more enzymes, simply add different cleavage rules here
        case EnzymeType::Trypsin:  // Trypsin KR
            for (unsigned index = 1; index < sequence_length; ++index) {
                if ((compact_sequence[index - 1] == 'K' || compact_sequence[index - 1] == 'R')
                    && compact_sequence[index] != 'P') {
                    cleavage_sites.push_back(index);
                }
            }
            break;
        default:
            throw std::runtime_error("Enzyme type is not supported.");
        }
        return cleavage_sites;
    }